

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackArchiveGenerator.cxx
# Opt level: O1

int __thiscall
cmCPackArchiveGenerator::PackageComponents(cmCPackArchiveGenerator *this,bool ignoreGroup)

{
  size_type *psVar1;
  archive *paVar2;
  pointer pcVar3;
  cmCPackLog *pcVar4;
  _Base_ptr p_Var5;
  _Alloc_hider msg;
  undefined8 uVar6;
  int iVar7;
  char *pcVar8;
  long *plVar9;
  ostream *poVar10;
  size_t sVar11;
  _Base_ptr p_Var12;
  undefined8 *puVar13;
  ulong *puVar14;
  undefined7 in_register_00000031;
  archive *paVar15;
  ulong *puVar16;
  bool bVar17;
  bool bVar18;
  string packageFileName;
  string localToplevel;
  cmArchiveWrite archive;
  ostringstream cmCPackLog_msg;
  cmGeneratedFileStream gf;
  string local_558;
  string local_538;
  _Rb_tree_node_base *local_518;
  long *local_510;
  long local_508;
  long local_500 [2];
  _Base_ptr local_4f0;
  string *local_4e8;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *local_4e0;
  string *local_4d8;
  undefined1 local_4d0 [16];
  undefined1 local_4c0 [56];
  size_type local_488;
  undefined1 local_3f0 [112];
  ios_base local_380 [264];
  undefined1 local_278 [112];
  ios_base local_208 [472];
  
  local_4e0 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
              &(this->super_cmCPackGenerator).packageFileNames;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_erase_at_end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_4e0,
                    (this->super_cmCPackGenerator).packageFileNames.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  if ((int)CONCAT71(in_register_00000031,ignoreGroup) == 0) {
    local_518 = (this->super_cmCPackGenerator).ComponentGroups._M_t._M_impl.super__Rb_tree_header.
                _M_header._M_left;
    local_4f0 = &(this->super_cmCPackGenerator).ComponentGroups._M_t._M_impl.super__Rb_tree_header.
                 _M_header;
    bVar17 = local_518 == local_4f0;
    if (!bVar17) {
      puVar16 = (ulong *)(local_278 + 0x10);
      local_4d8 = &this->ArchiveFormat;
      do {
        pcVar8 = local_3f0 + 0x10;
        local_4e8 = (string *)CONCAT71(local_4e8._1_7_,bVar17);
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_278);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_278,"Packaging component group: ",0x1b);
        poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_278,*(char **)(local_518 + 1),
                             (long)local_518[1]._M_parent);
        std::ios::widen((char)poVar10->_vptr_basic_ostream[-3] + (char)poVar10);
        std::ostream::put((char)poVar10);
        std::ostream::flush();
        pcVar4 = (this->super_cmCPackGenerator).Logger;
        std::__cxx11::stringbuf::str();
        uVar6 = local_3f0._0_8_;
        sVar11 = strlen((char *)local_3f0._0_8_);
        cmCPackLog::Log(pcVar4,2,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CPack/cmCPackArchiveGenerator.cxx"
                        ,0x83,(char *)uVar6,sVar11);
        if ((char *)local_3f0._0_8_ != pcVar8) {
          operator_delete((void *)local_3f0._0_8_,local_3f0._16_8_ + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_278);
        std::ios_base::~ios_base(local_208);
        pcVar3 = (this->super_cmCPackGenerator).toplevel._M_dataplus._M_p;
        local_3f0._0_8_ = pcVar8;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_3f0,pcVar3,
                   pcVar3 + (this->super_cmCPackGenerator).toplevel._M_string_length);
        plVar9 = (long *)std::__cxx11::string::append((char *)local_3f0);
        puVar14 = (ulong *)(plVar9 + 2);
        if ((ulong *)*plVar9 == puVar14) {
          local_278._16_8_ = *puVar14;
          local_278._24_8_ = plVar9[3];
          local_278._0_8_ = puVar16;
        }
        else {
          local_278._16_8_ = *puVar14;
          local_278._0_8_ = (ulong *)*plVar9;
        }
        local_278._8_8_ = plVar9[1];
        *plVar9 = (long)puVar14;
        plVar9[1] = 0;
        *(undefined1 *)(plVar9 + 2) = 0;
        GetArchiveComponentFileName((string *)local_4d0,this,(string *)(local_518 + 1),true);
        paVar15 = (archive *)0xf;
        if ((ulong *)local_278._0_8_ != puVar16) {
          paVar15 = (archive *)local_278._16_8_;
        }
        paVar2 = (archive *)((long)(uint *)local_4d0._8_8_ + local_278._8_8_);
        if (paVar15 < paVar2) {
          paVar15 = (archive *)0xf;
          if ((ostream *)local_4d0._0_8_ != (ostream *)local_4c0) {
            paVar15 = (archive *)local_4c0._0_8_;
          }
          if (paVar15 < paVar2) goto LAB_0017b347;
          puVar13 = (undefined8 *)
                    std::__cxx11::string::replace((ulong)local_4d0,0,(char *)0x0,local_278._0_8_);
        }
        else {
LAB_0017b347:
          puVar13 = (undefined8 *)std::__cxx11::string::_M_append((char *)local_278,local_4d0._0_8_)
          ;
        }
        psVar1 = puVar13 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar13 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar1) {
          local_538.field_2._M_allocated_capacity = *psVar1;
          local_538.field_2._8_8_ = puVar13[3];
          local_538._M_dataplus._M_p = (pointer)&local_538.field_2;
        }
        else {
          local_538.field_2._M_allocated_capacity = *psVar1;
          local_538._M_dataplus._M_p = (pointer)*puVar13;
        }
        local_538._M_string_length = puVar13[1];
        *puVar13 = psVar1;
        puVar13[1] = 0;
        *(undefined1 *)psVar1 = 0;
        if ((ostream *)local_4d0._0_8_ != (ostream *)local_4c0) {
          operator_delete((void *)local_4d0._0_8_,(ulong)(local_4c0._0_8_ + 1));
        }
        if ((ulong *)local_278._0_8_ != puVar16) {
          operator_delete((void *)local_278._0_8_,local_278._16_8_ + 1);
        }
        if ((char *)local_3f0._0_8_ != pcVar8) {
          operator_delete((void *)local_3f0._0_8_,local_3f0._16_8_ + 1);
        }
        cmGeneratedFileStream::cmGeneratedFileStream((cmGeneratedFileStream *)local_278,None);
        cmGeneratedFileStream::Open((cmGeneratedFileStream *)local_278,&local_538,false,true);
        iVar7 = (*(this->super_cmCPackGenerator)._vptr_cmCPackGenerator[0x1d])
                          (this,(ostringstream *)local_278);
        if (iVar7 == 0) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3f0);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_3f0,"Problem to generate Header for archive <",0x28);
          poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_3f0,local_538._M_dataplus._M_p,
                               local_538._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar10,">.",2);
          std::ios::widen((char)poVar10->_vptr_basic_ostream[-3] + (char)poVar10);
          std::ostream::put((char)poVar10);
          std::ostream::flush();
          pcVar4 = (this->super_cmCPackGenerator).Logger;
          std::__cxx11::stringbuf::str();
          uVar6 = local_4d0._0_8_;
          sVar11 = strlen((char *)local_4d0._0_8_);
          cmCPackLog::Log(pcVar4,0x10,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CPack/cmCPackArchiveGenerator.cxx"
                          ,0x8b,(char *)uVar6,sVar11);
          if ((ostream *)local_4d0._0_8_ != (ostream *)local_4c0) {
            operator_delete((void *)local_4d0._0_8_,(ulong)(local_4c0._0_8_ + 1));
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_3f0);
          std::ios_base::~ios_base(local_380);
          bVar17 = false;
        }
        else {
          cmArchiveWrite::cmArchiveWrite
                    ((cmArchiveWrite *)local_4d0,(ostream *)local_278,this->Compress,local_4d8);
          bVar17 = local_488 == 0;
          if (bVar17) {
            p_Var5 = local_518[5]._M_left;
            for (p_Var12 = local_518[5]._M_parent; p_Var12 != p_Var5;
                p_Var12 = (_Base_ptr)&p_Var12->_M_parent) {
              addOneComponentToArchive
                        (this,(cmArchiveWrite *)local_4d0,*(cmCPackComponent **)p_Var12);
            }
          }
          else {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3f0);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_3f0,"Problem to create archive <",0x1b);
            poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_3f0,local_538._M_dataplus._M_p,
                                 local_538._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar10,">, ERROR = ",0xb);
            local_558._M_dataplus._M_p = (pointer)&local_558.field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_558,local_4c0._48_8_,(pointer)(local_4c0._48_8_ + local_488)
                      );
            poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                                (poVar10,local_558._M_dataplus._M_p,local_558._M_string_length);
            std::ios::widen((char)poVar10->_vptr_basic_ostream[-3] + (char)poVar10);
            std::ostream::put((char)poVar10);
            std::ostream::flush();
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_558._M_dataplus._M_p != &local_558.field_2) {
              operator_delete(local_558._M_dataplus._M_p,local_558.field_2._M_allocated_capacity + 1
                             );
            }
            pcVar4 = (this->super_cmCPackGenerator).Logger;
            std::__cxx11::stringbuf::str();
            msg._M_p = local_558._M_dataplus._M_p;
            sVar11 = strlen(local_558._M_dataplus._M_p);
            cmCPackLog::Log(pcVar4,0x10,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CPack/cmCPackArchiveGenerator.cxx"
                            ,0x8b,msg._M_p,sVar11);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_558._M_dataplus._M_p != &local_558.field_2) {
              operator_delete(local_558._M_dataplus._M_p,local_558.field_2._M_allocated_capacity + 1
                             );
            }
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_3f0);
            std::ios_base::~ios_base(local_380);
          }
          cmArchiveWrite::~cmArchiveWrite((cmArchiveWrite *)local_4d0);
        }
        cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_278);
        if (!bVar17) {
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_538._M_dataplus._M_p != &local_538.field_2) {
            operator_delete(local_538._M_dataplus._M_p,local_538.field_2._M_allocated_capacity + 1);
          }
LAB_0017b7e0:
          if (((ulong)local_4e8 & 1) == 0) {
            return 0;
          }
          break;
        }
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>(local_4e0,&local_538);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_538._M_dataplus._M_p != &local_538.field_2) {
          operator_delete(local_538._M_dataplus._M_p,local_538.field_2._M_allocated_capacity + 1);
        }
        if (!bVar17) goto LAB_0017b7e0;
        local_518 = (_Rb_tree_node_base *)std::_Rb_tree_increment(local_518);
        bVar17 = local_518 == local_4f0;
      } while (!bVar17);
    }
    p_Var12 = (this->super_cmCPackGenerator).Components._M_t._M_impl.super__Rb_tree_header._M_header
              ._M_left;
    local_518 = &(this->super_cmCPackGenerator).Components._M_t._M_impl.super__Rb_tree_header.
                 _M_header;
    bVar17 = p_Var12 == local_518;
    if (!bVar17) {
      local_4e8 = &this->ArchiveFormat;
      do {
        if (*(long *)(p_Var12 + 4) == 0) {
          local_4f0 = (_Base_ptr)CONCAT71(local_4f0._1_7_,bVar17);
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_278);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_278,"Component <",0xb)
          ;
          poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_278,*(char **)(p_Var12 + 2),
                               (long)p_Var12[2]._M_parent);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar10,"> does not belong to any group, package it separately.",0x36);
          std::ios::widen((char)poVar10->_vptr_basic_ostream[-3] + (char)poVar10);
          std::ostream::put((char)poVar10);
          std::ostream::flush();
          pcVar4 = (this->super_cmCPackGenerator).Logger;
          std::__cxx11::stringbuf::str();
          uVar6 = local_3f0._0_8_;
          sVar11 = strlen((char *)local_3f0._0_8_);
          cmCPackLog::Log(pcVar4,2,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CPack/cmCPackArchiveGenerator.cxx"
                          ,0x9e,(char *)uVar6,sVar11);
          puVar16 = (ulong *)(local_278 + 0x10);
          if ((undefined1 *)local_3f0._0_8_ != local_3f0 + 0x10) {
            operator_delete((void *)local_3f0._0_8_,local_3f0._16_8_ + 1);
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_278);
          std::ios_base::~ios_base(local_208);
          local_278._0_8_ = puVar16;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_278,"CPACK_TEMPORARY_DIRECTORY","");
          pcVar8 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,(string *)local_278);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_538,pcVar8,(allocator<char> *)local_3f0);
          if ((ulong *)local_278._0_8_ != puVar16) {
            operator_delete((void *)local_278._0_8_,local_278._16_8_ + 1);
          }
          local_558._M_dataplus._M_p = (pointer)&local_558.field_2;
          pcVar3 = (this->super_cmCPackGenerator).toplevel._M_dataplus._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_558,pcVar3,
                     pcVar3 + (this->super_cmCPackGenerator).toplevel._M_string_length);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_278,"/",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (p_Var12 + 1));
          std::__cxx11::string::_M_append((char *)&local_538,local_278._0_8_);
          if ((ulong *)local_278._0_8_ != puVar16) {
            operator_delete((void *)local_278._0_8_,local_278._16_8_ + 1);
          }
          GetArchiveComponentFileName((string *)local_3f0,this,(string *)(p_Var12 + 1),false);
          plVar9 = (long *)std::__cxx11::string::replace((ulong)local_3f0,0,(char *)0x0,0x53c9fd);
          puVar14 = (ulong *)(plVar9 + 2);
          if ((ulong *)*plVar9 == puVar14) {
            local_278._16_8_ = *puVar14;
            local_278._24_8_ = plVar9[3];
            local_278._0_8_ = puVar16;
          }
          else {
            local_278._16_8_ = *puVar14;
            local_278._0_8_ = (ulong *)*plVar9;
          }
          local_278._8_8_ = plVar9[1];
          *plVar9 = (long)puVar14;
          plVar9[1] = 0;
          *(undefined1 *)(plVar9 + 2) = 0;
          std::__cxx11::string::_M_append((char *)&local_558,local_278._0_8_);
          if ((ulong *)local_278._0_8_ != puVar16) {
            operator_delete((void *)local_278._0_8_,local_278._16_8_ + 1);
          }
          if ((undefined1 *)local_3f0._0_8_ != local_3f0 + 0x10) {
            operator_delete((void *)local_3f0._0_8_,local_3f0._16_8_ + 1);
          }
          cmGeneratedFileStream::cmGeneratedFileStream((cmGeneratedFileStream *)local_278,None);
          cmGeneratedFileStream::Open((cmGeneratedFileStream *)local_278,&local_558,false,true);
          iVar7 = (*(this->super_cmCPackGenerator)._vptr_cmCPackGenerator[0x1d])
                            (this,(cmGeneratedFileStream *)local_278);
          if (iVar7 == 0) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3f0);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_3f0,"Problem to generate Header for archive <",0x28);
            poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_3f0,local_558._M_dataplus._M_p,
                                 local_558._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar10,">.",2);
            std::ios::widen((char)poVar10->_vptr_basic_ostream[-3] + (char)poVar10);
            std::ostream::put((char)poVar10);
            std::ostream::flush();
            pcVar4 = (this->super_cmCPackGenerator).Logger;
            std::__cxx11::stringbuf::str();
            uVar6 = local_4d0._0_8_;
            sVar11 = strlen((char *)local_4d0._0_8_);
            cmCPackLog::Log(pcVar4,0x10,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CPack/cmCPackArchiveGenerator.cxx"
                            ,0xa8,(char *)uVar6,sVar11);
            if ((ostream *)local_4d0._0_8_ != (ostream *)local_4c0) {
              operator_delete((void *)local_4d0._0_8_,(ulong)(local_4c0._0_8_ + 1));
            }
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_3f0);
            std::ios_base::~ios_base(local_380);
            bVar17 = false;
          }
          else {
            cmArchiveWrite::cmArchiveWrite
                      ((cmArchiveWrite *)local_4d0,(ostream *)local_278,this->Compress,local_4e8);
            bVar17 = local_488 == 0;
            if (bVar17) {
              addOneComponentToArchive
                        (this,(cmArchiveWrite *)local_4d0,(cmCPackComponent *)(p_Var12 + 2));
            }
            else {
              std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3f0);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_3f0,"Problem to create archive <",0x1b);
              poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)local_3f0,local_558._M_dataplus._M_p,
                                   local_558._M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>(poVar10,">, ERROR = ",0xb);
              local_510 = local_500;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_510,local_4c0._48_8_,
                         (pointer)(local_4c0._48_8_ + local_488));
              poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                                  (poVar10,(char *)local_510,local_508);
              std::ios::widen((char)poVar10->_vptr_basic_ostream[-3] + (char)poVar10);
              std::ostream::put((char)poVar10);
              std::ostream::flush();
              if (local_510 != local_500) {
                operator_delete(local_510,local_500[0] + 1);
              }
              pcVar4 = (this->super_cmCPackGenerator).Logger;
              std::__cxx11::stringbuf::str();
              plVar9 = local_510;
              sVar11 = strlen((char *)local_510);
              cmCPackLog::Log(pcVar4,0x10,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CPack/cmCPackArchiveGenerator.cxx"
                              ,0xa8,(char *)plVar9,sVar11);
              if (local_510 != local_500) {
                operator_delete(local_510,local_500[0] + 1);
              }
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_3f0);
              std::ios_base::~ios_base(local_380);
            }
            cmArchiveWrite::~cmArchiveWrite((cmArchiveWrite *)local_4d0);
          }
          cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_278);
          if (!bVar17) {
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_558._M_dataplus._M_p != &local_558.field_2) {
              operator_delete(local_558._M_dataplus._M_p,local_558.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_538._M_dataplus._M_p != &local_538.field_2) {
              operator_delete(local_538._M_dataplus._M_p,local_538.field_2._M_allocated_capacity + 1
                             );
            }
LAB_0017be79:
            if (((ulong)local_4f0 & 1) != 0) {
              return 1;
            }
            return 0;
          }
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>(local_4e0,&local_558);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_558._M_dataplus._M_p != &local_558.field_2) {
            operator_delete(local_558._M_dataplus._M_p,local_558.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_538._M_dataplus._M_p != &local_538.field_2) {
            operator_delete(local_538._M_dataplus._M_p,local_538.field_2._M_allocated_capacity + 1);
          }
          if (!bVar17) goto LAB_0017be79;
        }
        p_Var12 = (_Base_ptr)std::_Rb_tree_increment(p_Var12);
        bVar17 = p_Var12 == local_518;
      } while (!bVar17);
    }
  }
  else {
    p_Var12 = (this->super_cmCPackGenerator).Components._M_t._M_impl.super__Rb_tree_header._M_header
              ._M_left;
    local_518 = &(this->super_cmCPackGenerator).Components._M_t._M_impl.super__Rb_tree_header.
                 _M_header;
    bVar17 = p_Var12 == local_518;
    if (!bVar17) {
      local_4f0 = (_Base_ptr)&this->ArchiveFormat;
      do {
        puVar16 = (ulong *)(local_278 + 0x10);
        local_278._0_8_ = puVar16;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_278,"CPACK_TEMPORARY_DIRECTORY","");
        pcVar8 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,(string *)local_278);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_538,pcVar8,(allocator<char> *)local_3f0);
        if ((ulong *)local_278._0_8_ != puVar16) {
          operator_delete((void *)local_278._0_8_,local_278._16_8_ + 1);
        }
        local_558._M_dataplus._M_p = (pointer)&local_558.field_2;
        pcVar3 = (this->super_cmCPackGenerator).toplevel._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_558,pcVar3,
                   pcVar3 + (this->super_cmCPackGenerator).toplevel._M_string_length);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_278,"/",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (p_Var12 + 1));
        std::__cxx11::string::_M_append((char *)&local_538,local_278._0_8_);
        if ((ulong *)local_278._0_8_ != puVar16) {
          operator_delete((void *)local_278._0_8_,local_278._16_8_ + 1);
        }
        GetArchiveComponentFileName((string *)local_3f0,this,(string *)(p_Var12 + 1),false);
        plVar9 = (long *)std::__cxx11::string::replace((ulong)local_3f0,0,(char *)0x0,0x53c9fd);
        puVar14 = (ulong *)(plVar9 + 2);
        if ((ulong *)*plVar9 == puVar14) {
          local_278._16_8_ = *puVar14;
          local_278._24_8_ = plVar9[3];
          local_278._0_8_ = puVar16;
        }
        else {
          local_278._16_8_ = *puVar14;
          local_278._0_8_ = (ulong *)*plVar9;
        }
        local_278._8_8_ = plVar9[1];
        *plVar9 = (long)puVar14;
        plVar9[1] = 0;
        *(undefined1 *)(plVar9 + 2) = 0;
        std::__cxx11::string::_M_append((char *)&local_558,local_278._0_8_);
        if ((ulong *)local_278._0_8_ != puVar16) {
          operator_delete((void *)local_278._0_8_,local_278._16_8_ + 1);
        }
        if ((undefined1 *)local_3f0._0_8_ != local_3f0 + 0x10) {
          operator_delete((void *)local_3f0._0_8_,local_3f0._16_8_ + 1);
        }
        cmGeneratedFileStream::cmGeneratedFileStream((cmGeneratedFileStream *)local_278,None);
        cmGeneratedFileStream::Open((cmGeneratedFileStream *)local_278,&local_558,false,true);
        iVar7 = (*(this->super_cmCPackGenerator)._vptr_cmCPackGenerator[0x1d])
                          (this,(cmGeneratedFileStream *)local_278);
        if (iVar7 == 0) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3f0);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_3f0,"Problem to generate Header for archive <",0x28);
          poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_3f0,local_558._M_dataplus._M_p,
                               local_558._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar10,">.",2);
          std::ios::widen((char)poVar10->_vptr_basic_ostream[-3] + (char)poVar10);
          std::ostream::put((char)poVar10);
          std::ostream::flush();
          pcVar4 = (this->super_cmCPackGenerator).Logger;
          std::__cxx11::stringbuf::str();
          uVar6 = local_4d0._0_8_;
          sVar11 = strlen((char *)local_4d0._0_8_);
          cmCPackLog::Log(pcVar4,0x10,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CPack/cmCPackArchiveGenerator.cxx"
                          ,0xbd,(char *)uVar6,sVar11);
          if ((ostream *)local_4d0._0_8_ != (ostream *)local_4c0) {
            operator_delete((void *)local_4d0._0_8_,(ulong)(local_4c0._0_8_ + 1));
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_3f0);
          std::ios_base::~ios_base(local_380);
          bVar18 = false;
        }
        else {
          cmArchiveWrite::cmArchiveWrite
                    ((cmArchiveWrite *)local_4d0,(ostream *)local_278,this->Compress,
                     (string *)local_4f0);
          bVar18 = local_488 == 0;
          if (bVar18) {
            addOneComponentToArchive
                      (this,(cmArchiveWrite *)local_4d0,(cmCPackComponent *)(p_Var12 + 2));
          }
          else {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3f0);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_3f0,"Problem to create archive <",0x1b);
            poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_3f0,local_558._M_dataplus._M_p,
                                 local_558._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar10,">, ERROR = ",0xb);
            local_510 = local_500;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_510,local_4c0._48_8_,(pointer)(local_4c0._48_8_ + local_488)
                      );
            poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                                (poVar10,(char *)local_510,local_508);
            std::ios::widen((char)poVar10->_vptr_basic_ostream[-3] + (char)poVar10);
            std::ostream::put((char)poVar10);
            std::ostream::flush();
            if (local_510 != local_500) {
              operator_delete(local_510,local_500[0] + 1);
            }
            pcVar4 = (this->super_cmCPackGenerator).Logger;
            std::__cxx11::stringbuf::str();
            plVar9 = local_510;
            sVar11 = strlen((char *)local_510);
            cmCPackLog::Log(pcVar4,0x10,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CPack/cmCPackArchiveGenerator.cxx"
                            ,0xbd,(char *)plVar9,sVar11);
            if (local_510 != local_500) {
              operator_delete(local_510,local_500[0] + 1);
            }
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_3f0);
            std::ios_base::~ios_base(local_380);
          }
          cmArchiveWrite::~cmArchiveWrite((cmArchiveWrite *)local_4d0);
        }
        cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_278);
        if (!bVar18) {
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_558._M_dataplus._M_p != &local_558.field_2) {
            operator_delete(local_558._M_dataplus._M_p,local_558.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_538._M_dataplus._M_p != &local_538.field_2) {
            operator_delete(local_538._M_dataplus._M_p,local_538.field_2._M_allocated_capacity + 1);
          }
LAB_0017b7ba:
          if (bVar17) {
            return 1;
          }
          return 0;
        }
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>(local_4e0,&local_558);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_558._M_dataplus._M_p != &local_558.field_2) {
          operator_delete(local_558._M_dataplus._M_p,local_558.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_538._M_dataplus._M_p != &local_538.field_2) {
          operator_delete(local_538._M_dataplus._M_p,local_538.field_2._M_allocated_capacity + 1);
        }
        if (!bVar18) goto LAB_0017b7ba;
        p_Var12 = (_Base_ptr)std::_Rb_tree_increment(p_Var12);
        bVar17 = p_Var12 == local_518;
      } while (!bVar17);
    }
  }
  return 1;
}

Assistant:

int cmCPackArchiveGenerator::PackageComponents(bool ignoreGroup)
{
  packageFileNames.clear();
  // The default behavior is to have one package by component group
  // unless CPACK_COMPONENTS_IGNORE_GROUP is specified.
  if (!ignoreGroup) {
    for (auto const& compG : this->ComponentGroups) {
      cmCPackLogger(cmCPackLog::LOG_VERBOSE,
                    "Packaging component group: " << compG.first << std::endl);
      // Begin the archive for this group
      std::string packageFileName = std::string(toplevel) + "/" +
        this->GetArchiveComponentFileName(compG.first, true);

      // open a block in order to automatically close archive
      // at the end of the block
      {
        DECLARE_AND_OPEN_ARCHIVE(packageFileName, archive);
        // now iterate over the component of this group
        for (cmCPackComponent* comp : (compG.second).Components) {
          // Add the files of this component to the archive
          addOneComponentToArchive(archive, comp);
        }
      }
      // add the generated package to package file names list
      packageFileNames.push_back(std::move(packageFileName));
    }
    // Handle Orphan components (components not belonging to any groups)
    for (auto& comp : this->Components) {
      // Does the component belong to a group?
      if (comp.second.Group == nullptr) {
        cmCPackLogger(
          cmCPackLog::LOG_VERBOSE,
          "Component <"
            << comp.second.Name
            << "> does not belong to any group, package it separately."
            << std::endl);
        std::string localToplevel(
          this->GetOption("CPACK_TEMPORARY_DIRECTORY"));
        std::string packageFileName = std::string(toplevel);

        localToplevel += "/" + comp.first;
        packageFileName +=
          "/" + this->GetArchiveComponentFileName(comp.first, false);

        {
          DECLARE_AND_OPEN_ARCHIVE(packageFileName, archive);
          // Add the files of this component to the archive
          addOneComponentToArchive(archive, &(comp.second));
        }
        // add the generated package to package file names list
        packageFileNames.push_back(std::move(packageFileName));
      }
    }
  }
  // CPACK_COMPONENTS_IGNORE_GROUPS is set
  // We build 1 package per component
  else {
    for (auto& comp : this->Components) {
      std::string localToplevel(this->GetOption("CPACK_TEMPORARY_DIRECTORY"));
      std::string packageFileName = std::string(toplevel);

      localToplevel += "/" + comp.first;
      packageFileName +=
        "/" + this->GetArchiveComponentFileName(comp.first, false);

      {
        DECLARE_AND_OPEN_ARCHIVE(packageFileName, archive);
        // Add the files of this component to the archive
        addOneComponentToArchive(archive, &(comp.second));
      }
      // add the generated package to package file names list
      packageFileNames.push_back(std::move(packageFileName));
    }
  }
  return 1;
}